

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

JITJavascriptString ** __thiscall
Memory::AllocateArray<Memory::JitArenaAllocator,JITJavascriptString*,false>
          (Memory *this,JitArenaAllocator *allocator,offset_in_JitArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  undefined1 auVar1 [16];
  size_t byteSize;
  size_t count_local;
  offset_in_JitArenaAllocator_to_subr AllocFunc_local;
  JitArenaAllocator *allocator_local;
  undefined8 local_10;
  
  if (count == 0) {
    ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ClearTrackAllocInfo
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,
               (TrackAllocData *)0x0);
    local_10 = (JITJavascriptString **)0x8;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      byteSize = 0xffffffffffffffff;
    }
    local_10 = (JITJavascriptString **)
               new__<Memory::JitArenaAllocator>
                         (byteSize,(JitArenaAllocator *)this,
                          (offset_in_JitArenaAllocator_to_subr)allocator);
  }
  return local_10;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}